

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::StringMaker<bool,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<bool,void> *this,bool b)

{
  char *__s;
  allocator<char> local_12;
  byte local_11;
  string *psStack_10;
  bool b_local;
  
  local_11 = (byte)this & 1;
  __s = "false";
  if (((ulong)this & 1) != 0) {
    __s = "true";
  }
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_12)
  ;
  std::allocator<char>::~allocator(&local_12);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<bool>::convert(bool b) {
    return b ? "true" : "false";
}